

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BtreeGetMeta(Btree *p,int idx,u32 *pMeta)

{
  BtShared *pBVar1;
  u32 uVar2;
  BtShared *pBt;
  u32 *pMeta_local;
  int idx_local;
  Btree *p_local;
  
  pBVar1 = p->pBt;
  sqlite3BtreeEnter(p);
  if (idx == 0xf) {
    uVar2 = sqlite3PagerDataVersion(pBVar1->pPager);
    *pMeta = uVar2 + p->iBDataVersion;
  }
  else {
    uVar2 = sqlite3Get4byte(pBVar1->pPage1->aData + (idx * 4 + 0x24));
    *pMeta = uVar2;
  }
  sqlite3BtreeLeave(p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BtreeGetMeta(Btree *p, int idx, u32 *pMeta){
  BtShared *pBt = p->pBt;

  sqlite3BtreeEnter(p);
  assert( p->inTrans>TRANS_NONE );
  assert( SQLITE_OK==querySharedCacheTableLock(p, SCHEMA_ROOT, READ_LOCK) );
  assert( pBt->pPage1 );
  assert( idx>=0 && idx<=15 );

  if( idx==BTREE_DATA_VERSION ){
    *pMeta = sqlite3PagerDataVersion(pBt->pPager) + p->iBDataVersion;
  }else{
    *pMeta = get4byte(&pBt->pPage1->aData[36 + idx*4]);
  }

  /* If auto-vacuum is disabled in this build and this is an auto-vacuum
  ** database, mark the database as read-only.  */
#ifdef SQLITE_OMIT_AUTOVACUUM
  if( idx==BTREE_LARGEST_ROOT_PAGE && *pMeta>0 ){
    pBt->btsFlags |= BTS_READ_ONLY;
  }
#endif

  sqlite3BtreeLeave(p);
}